

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrins.cpp
# Opt level: O1

long c_drive(long num,long degree,long speed)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  if ((ulong)num < 4) {
    lVar1 = 100;
    if (speed < 100) {
      lVar1 = speed;
    }
    lVar3 = 0;
    if (0 < lVar1) {
      lVar3 = lVar1;
    }
    uVar2 = -degree;
    if (0 < degree) {
      uVar2 = degree;
    }
    uVar4 = uVar2 % 0x168;
    if (uVar2 < 0x168) {
      uVar4 = uVar2;
    }
    if (r_debug != 0) {
      printf("\ndrive: degree %ld, speed %ld\n",uVar4,lVar3);
    }
    robots[num].d_heading = (int)uVar4;
    robots[num].d_speed = (int)lVar3;
    return 1;
  }
  __assert_fail("num >= 0 && num <= 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/intrins.cpp"
                ,0xb6,"long c_drive(long, long, long)");
}

Assistant:

long c_drive(long num, long degree, long speed)
{
  assert(num >= 0 && num <= 3);
  struct robot *cur_robot = &robots[num];

  // speed = pop();
  if (speed < 0L)
    speed = 0L;
  else if (speed > 100L)
    speed = 100L;
  // degree = pop();
  if (degree < 0L)
    degree = -degree;
  if (degree >= 360L)
    degree %= 360L;

  if (r_debug)
    printf("\ndrive: degree %ld, speed %ld\n", degree, speed);

  /* update desired speed and heading */
  cur_robot->d_heading = (int)degree;
  cur_robot->d_speed = (int)speed;

  return (1L);
}